

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O1

void beltMACStepA(void *buf,size_t count,void *state)

{
  ulong uVar1;
  void *dest;
  
  uVar1 = *(ulong *)((long)state + 0x60);
  if (uVar1 < 0x10) {
    dest = (void *)((long)state + uVar1 + 0x50);
    if (count <= 0x10 - uVar1) {
      memCopy(dest,buf,count);
      count = count + *(long *)((long)state + 0x60);
      goto LAB_001332f2;
    }
    memCopy(dest,buf,0x10 - uVar1);
    count = (count + *(long *)((long)state + 0x60)) - 0x10;
    buf = (void *)((long)buf + (0x10 - *(long *)((long)state + 0x60)));
    *(undefined8 *)((long)state + 0x60) = 0x10;
  }
  if (0xf < count) {
    do {
      *(uint *)((long)state + 0x20) = *(uint *)((long)state + 0x50) ^ *(uint *)((long)state + 0x20);
      *(uint *)((long)state + 0x24) = *(uint *)((long)state + 0x54) ^ *(uint *)((long)state + 0x24);
      *(uint *)((long)state + 0x28) = *(uint *)((long)state + 0x58) ^ *(uint *)((long)state + 0x28);
      *(uint *)((long)state + 0x2c) = *(uint *)((long)state + 0x5c) ^ *(uint *)((long)state + 0x2c);
      beltBlockEncr2((u32 *)((long)state + 0x20),(u32 *)state);
      *(undefined8 *)((long)state + 0x50) = *buf;
      *(undefined8 *)((long)state + 0x58) = *(undefined8 *)((long)buf + 8);
      buf = (void *)((long)buf + 0x10);
      count = count - 0x10;
    } while (0xf < count);
  }
  if (count == 0) {
    return;
  }
  *(uint *)((long)state + 0x20) = *(uint *)((long)state + 0x50) ^ *(uint *)((long)state + 0x20);
  *(uint *)((long)state + 0x24) = *(uint *)((long)state + 0x54) ^ *(uint *)((long)state + 0x24);
  *(uint *)((long)state + 0x28) = *(uint *)((long)state + 0x58) ^ *(uint *)((long)state + 0x28);
  *(uint *)((long)state + 0x2c) = *(uint *)((long)state + 0x5c) ^ *(uint *)((long)state + 0x2c);
  beltBlockEncr2((u32 *)((long)state + 0x20),(u32 *)state);
  memCopy((void *)((long)state + 0x50),buf,count);
LAB_001332f2:
  *(size_t *)((long)state + 0x60) = count;
  return;
}

Assistant:

void beltMACStepA(const void* buf, size_t count, void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltMAC_keep()));
	// накопить полный блок
	if (st->filled < 16)
	{
		if (count <= 16 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 16 - st->filled);
		count -= 16 - st->filled;
		buf = (const octet*)buf + 16 - st->filled;
		st->filled = 16;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor2(st->s, st->block);
		beltBlockEncr2(st->s, st->key);
		beltBlockCopy(st->block, buf);
		buf = (const octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor2(st->s, st->block);
		beltBlockEncr2(st->s, st->key);
		memCopy(st->block, buf, count);
		st->filled = count;
	}
}